

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

iterator * __thiscall boost::filesystem::path::begin(iterator *__return_storage_ptr__,path *this)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->m_element).m_pathname._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_element).m_pathname.field_2;
  (__return_storage_ptr__->m_element).m_pathname._M_string_length = 0;
  (__return_storage_ptr__->m_element).m_pathname.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_path_ptr = this;
  uVar1 = (this->m_pathname)._M_string_length;
  __return_storage_ptr__->m_pos = 0;
  if (uVar1 != 0) {
    if ((((uVar1 == 1) || (pcVar2 = (this->m_pathname)._M_dataplus._M_p, *pcVar2 != '/')) ||
        (pcVar2[1] != '/')) || ((uVar4 = 2, uVar1 != 2 && (pcVar2[2] == '/')))) {
      pcVar2 = (this->m_pathname)._M_dataplus._M_p;
      if (*pcVar2 == '/') {
        if (uVar1 != 1) {
          uVar4 = 1;
          do {
            if (pcVar2[uVar4] != '/') break;
            __return_storage_ptr__->m_pos = uVar4;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        goto LAB_0010f34a;
      }
      uVar4 = 0;
    }
    if (uVar4 < uVar1) {
      do {
        if ((this->m_pathname)._M_dataplus._M_p[uVar4] == '/') break;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
LAB_0010f34a:
  std::__cxx11::string::substr((ulong)local_38,(ulong)this);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,
               (char *)(__return_storage_ptr__->m_element).m_pathname._M_string_length,0x114024);
  }
  return __return_storage_ptr__;
}

Assistant:

path::iterator path::begin() const
  {
    iterator itr;
    itr.m_path_ptr = this;
    size_type element_size;
    first_element(m_pathname, itr.m_pos, element_size);
    itr.m_element = m_pathname.substr(itr.m_pos, element_size);
    if (itr.m_element.m_pathname == preferred_separator_string)
      itr.m_element.m_pathname = separator_string;  // needed for Windows, harmless on POSIX
    return itr;
  }